

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool tinygltf::ParseSparseAccessor(Accessor *accessor,string *err,json *o)

{
  json *pjVar1;
  json *pjVar2;
  bool bVar3;
  allocator local_281;
  string local_280;
  allocator local_259;
  string local_258;
  allocator local_231;
  string local_230;
  allocator local_209;
  string local_208;
  int local_1e4;
  int local_1e0;
  int values_byte_offset;
  int values_buffer_view;
  allocator local_1b1;
  string local_1b0;
  allocator local_189;
  string local_188;
  allocator local_161;
  string local_160;
  allocator local_139;
  string local_138;
  allocator local_111;
  string local_110;
  int local_ec;
  int local_e8;
  int component_type;
  int indices_byte_offset;
  int indices_buffer_view;
  json *values_obj;
  json *indices_obj;
  json_const_iterator values_iterator;
  json_const_iterator indices_iterator;
  string local_88;
  allocator local_51;
  string local_50;
  int local_2c;
  json *pjStack_28;
  int count;
  json *o_local;
  string *err_local;
  Accessor *accessor_local;
  
  (accessor->sparse).isSparse = true;
  local_2c = 0;
  pjStack_28 = o;
  o_local = (json *)err;
  err_local = (string *)accessor;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"count",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_88,"",
             (allocator *)((long)&indices_iterator.m_it.primitive_iterator.m_it + 7));
  ParseIntegerProperty(&local_2c,err,o,&local_50,true,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&indices_iterator.m_it.primitive_iterator.m_it + 7));
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  nlohmann::detail::
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::iter_impl((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *)&values_iterator.m_it.primitive_iterator);
  nlohmann::detail::
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::iter_impl((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *)&indices_obj);
  bVar3 = anon_unknown_57::FindMember
                    (pjStack_28,"indices",
                     (json_const_iterator *)&values_iterator.m_it.primitive_iterator);
  if (bVar3) {
    bVar3 = anon_unknown_57::FindMember(pjStack_28,"values",(json_const_iterator *)&indices_obj);
    if (bVar3) {
      values_obj = anon_unknown_57::GetValue
                             ((json_const_iterator *)&values_iterator.m_it.primitive_iterator);
      _indices_byte_offset = anon_unknown_57::GetValue((json_const_iterator *)&indices_obj);
      pjVar2 = o_local;
      pjVar1 = values_obj;
      component_type = 0;
      local_e8 = 0;
      local_ec = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_110,"bufferView",&local_111);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_138,"",&local_139);
      ParseIntegerProperty(&component_type,(string *)pjVar2,pjVar1,&local_110,true,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
      pjVar2 = o_local;
      pjVar1 = values_obj;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_160,"byteOffset",&local_161);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_188,"",&local_189);
      ParseIntegerProperty(&local_e8,(string *)pjVar2,pjVar1,&local_160,true,&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::allocator<char>::~allocator((allocator<char> *)&local_189);
      std::__cxx11::string::~string((string *)&local_160);
      std::allocator<char>::~allocator((allocator<char> *)&local_161);
      pjVar2 = o_local;
      pjVar1 = values_obj;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1b0,"componentType",&local_1b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&values_buffer_view,"",(allocator *)((long)&values_byte_offset + 3));
      ParseIntegerProperty
                (&local_ec,(string *)pjVar2,pjVar1,&local_1b0,true,(string *)&values_buffer_view);
      std::__cxx11::string::~string((string *)&values_buffer_view);
      std::allocator<char>::~allocator((allocator<char> *)((long)&values_byte_offset + 3));
      std::__cxx11::string::~string((string *)&local_1b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
      pjVar2 = o_local;
      pjVar1 = _indices_byte_offset;
      local_1e0 = 0;
      local_1e4 = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_208,"bufferView",&local_209);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_230,"",&local_231);
      ParseIntegerProperty(&local_1e0,(string *)pjVar2,pjVar1,&local_208,true,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      std::allocator<char>::~allocator((allocator<char> *)&local_231);
      std::__cxx11::string::~string((string *)&local_208);
      std::allocator<char>::~allocator((allocator<char> *)&local_209);
      pjVar2 = o_local;
      pjVar1 = _indices_byte_offset;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_258,"byteOffset",&local_259);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_280,"",&local_281);
      ParseIntegerProperty(&local_1e4,(string *)pjVar2,pjVar1,&local_258,true,&local_280);
      std::__cxx11::string::~string((string *)&local_280);
      std::allocator<char>::~allocator((allocator<char> *)&local_281);
      std::__cxx11::string::~string((string *)&local_258);
      std::allocator<char>::~allocator((allocator<char> *)&local_259);
      *(int *)&err_local[8].field_2 = local_2c;
      *(int *)((long)&err_local[8].field_2 + 0xc) = component_type;
      *(int *)((long)&err_local[8].field_2 + 8) = local_e8;
      *(int *)(err_local + 9) = local_ec;
      *(int *)&err_local[9].field_0x4 = local_1e0;
      *(int *)&err_local[9]._M_string_length = local_1e4;
      accessor_local._7_1_ = true;
    }
    else {
      std::__cxx11::string::operator=
                ((string *)o_local,"the sparse object ob ths accessor doesn\'t have values");
      accessor_local._7_1_ = false;
    }
  }
  else {
    std::__cxx11::string::operator=
              ((string *)o_local,"the sparse object of this accessor doesn\'t have indices");
    accessor_local._7_1_ = false;
  }
  return accessor_local._7_1_;
}

Assistant:

static bool ParseSparseAccessor(Accessor *accessor, std::string *err,
                                const json &o) {
  accessor->sparse.isSparse = true;

  int count = 0;
  ParseIntegerProperty(&count, err, o, "count", true);

  json_const_iterator indices_iterator;
  json_const_iterator values_iterator;
  if (!FindMember(o, "indices", indices_iterator)) {
    (*err) = "the sparse object of this accessor doesn't have indices";
    return false;
  }

  if (!FindMember(o, "values", values_iterator)) {
    (*err) = "the sparse object ob ths accessor doesn't have values";
    return false;
  }

  const json &indices_obj = GetValue(indices_iterator);
  const json &values_obj = GetValue(values_iterator);

  int indices_buffer_view = 0, indices_byte_offset = 0, component_type = 0;
  ParseIntegerProperty(&indices_buffer_view, err, indices_obj, "bufferView",
                       true);
  ParseIntegerProperty(&indices_byte_offset, err, indices_obj, "byteOffset",
                       true);
  ParseIntegerProperty(&component_type, err, indices_obj, "componentType",
                       true);

  int values_buffer_view = 0, values_byte_offset = 0;
  ParseIntegerProperty(&values_buffer_view, err, values_obj, "bufferView",
                       true);
  ParseIntegerProperty(&values_byte_offset, err, values_obj, "byteOffset",
                       true);

  accessor->sparse.count = count;
  accessor->sparse.indices.bufferView = indices_buffer_view;
  accessor->sparse.indices.byteOffset = indices_byte_offset;
  accessor->sparse.indices.componentType = component_type;
  accessor->sparse.values.bufferView = values_buffer_view;
  accessor->sparse.values.byteOffset = values_byte_offset;

  // todo check theses values

  return true;
}